

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t *
flatcc_builder_append_offset_vector(flatcc_builder_t *B,flatcc_builder_ref_t *refs,size_t count)

{
  int iVar1;
  flatcc_builder_ref_t *pfVar2;
  
  if (B->frame->type != 5) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_offset_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3c9,
                  "flatcc_builder_ref_t *flatcc_builder_append_offset_vector(flatcc_builder_t *, const flatcc_builder_ref_t *, size_t)"
                 );
  }
  iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)count,0x3fffffff);
  if (iVar1 != 0) {
    return (flatcc_builder_ref_t *)0x0;
  }
  pfVar2 = (flatcc_builder_ref_t *)push_ds_copy(B,refs,(flatbuffers_uoffset_t)count << 2);
  return pfVar2;
}

Assistant:

flatcc_builder_ref_t *flatcc_builder_append_offset_vector(flatcc_builder_t *B, const flatcc_builder_ref_t *refs, size_t count)
{
    check(frame(type) == flatcc_builder_offset_vector, "expected offset vector frame");
    if (vector_count_add(B, (uoffset_t)count, max_offset_count)) {
        return 0;
    }
    return push_ds_copy(B, refs, (uoffset_t)(field_size * count));
}